

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<char>::prepare_int_buffer<fmt::AlignSpec>
          (BasicWriter<char> *this,uint num_digits,AlignSpec *spec,char *prefix,uint prefix_size)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  Alignment AVar4;
  Buffer<char> *pBVar5;
  size_t sVar6;
  size_t size;
  char *pcVar7;
  char *__s;
  uint uVar8;
  size_t __len;
  ulong uVar9;
  ptrdiff_t _Num;
  ulong uVar10;
  char __tmp;
  
  if ((int)num_digits < -1) {
    __assert_fail("(value >= 0) && \"negative value\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nuertey[P]spdlog/tests/../include/spdlog/sinks/../fmt/bundled/format.h"
                  ,0x30c,
                  "typename MakeUnsigned<Int>::Type fmt::internal::to_unsigned(Int) [Int = int]");
  }
  uVar9 = (ulong)num_digits;
  uVar3 = (spec->super_WidthSpec).width_;
  uVar10 = (ulong)uVar3;
  uVar8 = prefix_size + num_digits;
  pBVar5 = this->buffer_;
  sVar6 = pBVar5->size_;
  if (uVar8 < uVar3) {
    AVar4 = spec->align_;
    bVar2 = (byte)(spec->super_WidthSpec).fill_;
    uVar1 = sVar6 + uVar10;
    if (pBVar5->capacity_ < uVar1) {
      (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
    }
    pBVar5->size_ = uVar1;
    pcVar7 = this->buffer_->ptr_ + sVar6;
    __s = pcVar7 + uVar10;
    if (AVar4 == ALIGN_NUMERIC) {
      if (prefix_size == 0) {
LAB_0014f5a5:
        uVar9 = (ulong)uVar8;
      }
      else {
        memmove(pcVar7,prefix,(ulong)prefix_size);
        pcVar7 = pcVar7 + prefix_size;
      }
    }
    else {
      if (AVar4 == ALIGN_CENTER) {
        uVar10 = uVar10 - uVar8;
        uVar9 = uVar10 >> 1;
        if (1 < uVar10) {
          memset(pcVar7,(uint)bVar2,uVar9);
        }
        pcVar7 = pcVar7 + uVar9;
        if (uVar3 != uVar8) {
          memset(pcVar7 + uVar8,(uint)bVar2,uVar10 - uVar9);
        }
        goto LAB_0014f4e0;
      }
      if (AVar4 == ALIGN_LEFT) {
        if (prefix_size != 0) {
          memmove(pcVar7,prefix,(ulong)prefix_size);
        }
        __s = pcVar7 + uVar8;
        if (uVar3 != uVar8) {
          memset(__s,(uint)bVar2,uVar10 - uVar8);
        }
        goto LAB_0014f5c6;
      }
      if (prefix_size == 0) goto LAB_0014f5a5;
      memmove(__s + -(ulong)uVar8,prefix,(ulong)prefix_size);
      uVar9 = (ulong)uVar8;
    }
    if (__s + (-(long)pcVar7 - uVar9) != (char *)0x0) {
      memset(pcVar7,(uint)bVar2,(size_t)(__s + (-(long)pcVar7 - uVar9)));
    }
  }
  else {
    uVar10 = sVar6 + uVar8;
    if (pBVar5->capacity_ < uVar10) {
      (**pBVar5->_vptr_Buffer)(pBVar5,uVar10);
    }
    pBVar5->size_ = uVar10;
    pcVar7 = this->buffer_->ptr_ + sVar6;
LAB_0014f4e0:
    if (prefix_size != 0) {
      memmove(pcVar7,prefix,(ulong)prefix_size);
    }
    __s = pcVar7 + uVar8;
  }
LAB_0014f5c6:
  return __s + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec, const char *prefix, unsigned prefix_size)
{
    unsigned width = spec.width();
    Alignment align = spec.align();
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.precision() > static_cast<int>(num_digits))
    {
        // Octal prefix '0' is counted as a digit, so ignore it if precision
        // is specified.
        if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
            --prefix_size;
        unsigned number_size = prefix_size + internal::to_unsigned(spec.precision());
        AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
        if (number_size >= width)
            return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
        buffer_.reserve(width);
        unsigned fill_size = width - number_size;
        if (align != ALIGN_LEFT)
        {
            CharPtr p = grow_buffer(fill_size);
            std::uninitialized_fill(p, p + fill_size, fill);
        }
        CharPtr result = prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
        if (align == ALIGN_LEFT)
        {
            CharPtr p = grow_buffer(fill_size);
            std::uninitialized_fill(p, p + fill_size, fill);
        }
        return result;
    }
    unsigned size = prefix_size + num_digits;
    if (width <= size)
    {
        CharPtr p = grow_buffer(size);
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        return p + size - 1;
    }
    CharPtr p = grow_buffer(width);
    CharPtr end = p + width;
    if (align == ALIGN_LEFT)
    {
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        p += size;
        std::uninitialized_fill(p, end, fill);
    }
    else if (align == ALIGN_CENTER)
    {
        p = fill_padding(p, width, size, fill);
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        p += size;
    }
    else
    {
        if (align == ALIGN_NUMERIC)
        {
            if (prefix_size != 0)
            {
                p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
                size -= prefix_size;
            }
        }
        else
        {
            std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
        }
        std::uninitialized_fill(p, end - size, fill);
        p = end;
    }
    return p - 1;
}